

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_csv.cpp
# Opt level: O2

void duckdb::WriteCSVChunkInternal
               (ClientContext *context,FunctionData *bind_data,DataChunk *cast_chunk,
               MemoryStream *writer,DataChunk *input,bool *written_anything,
               ExpressionExecutor *executor)

{
  idx_t *this;
  uint uVar1;
  pointer pcVar2;
  bool bVar3;
  reference pvVar4;
  reference pvVar5;
  long lVar6;
  data_ptr_t pdVar7;
  _func_int **idx;
  idx_t col_idx;
  ulong __n;
  reference rVar8;
  
  DataChunk::Reset((DataChunk *)bind_data);
  bind_data[3]._vptr_FunctionData = (_func_int **)writer->position;
  ExpressionExecutor::Execute
            ((ExpressionExecutor *)written_anything,(DataChunk *)writer,(DataChunk *)bind_data);
  DataChunk::Flatten((DataChunk *)bind_data);
  this = &(context->config).merge_join_threshold;
  for (idx = (_func_int **)0x0; idx < bind_data[3]._vptr_FunctionData;
      idx = (_func_int **)((long)idx + 1)) {
    if ((idx == (_func_int **)0x0) &&
       (*(char *)&(input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                  super__Vector_impl_data._M_start == '\0')) {
      *(undefined1 *)
       &(input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_start = 1;
    }
    else {
      (**(code **)(cast_chunk->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                  super__Vector_impl_data._M_start)
                (cast_chunk,
                 *(undefined8 *)&context[1].config.result_collector.super__Function_base._M_functor,
                 *(undefined8 *)
                  ((long)&context[1].config.result_collector.super__Function_base._M_functor + 8));
    }
    lVar6 = (long)idx * 0x10;
    for (__n = 0; __n < (ulong)(((long)bind_data[1]._vptr_FunctionData -
                                (long)bind_data->_vptr_FunctionData) / 0x68); __n = __n + 1) {
      if (__n != 0) {
        WriteQuoteOrEscape((WriteStream *)cast_chunk,
                           *(char *)&((context->registered_state).
                                      super_unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
                                      ._M_t.
                                      super___uniq_ptr_impl<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
                                      .
                                      super__Head_base<0UL,_duckdb::RegisteredStateManager_*,_false>
                                     ._M_head_impl)->lock);
      }
      pvVar4 = vector<duckdb::Vector,_true>::get<true>
                         ((vector<duckdb::Vector,_true> *)bind_data,__n);
      bVar3 = FlatVector::IsNull(pvVar4,(idx_t)idx);
      if (bVar3) {
        pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ::get<true>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                              *)this,0);
        pcVar2 = (pvVar5->_M_dataplus)._M_p;
        pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ::get<true>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                              *)this,0);
        (**(code **)(cast_chunk->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                    .super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_start)(cast_chunk,pcVar2,pvVar5->_M_string_length);
      }
      else {
        pvVar4 = vector<duckdb::Vector,_true>::get<true>
                           ((vector<duckdb::Vector,_true> *)bind_data,__n);
        pdVar7 = pvVar4->data;
        uVar1 = *(uint *)(pdVar7 + lVar6);
        if ((ulong)uVar1 < 0xd) {
          pdVar7 = pdVar7 + lVar6 + 4;
        }
        else {
          pdVar7 = *(data_ptr_t *)(pdVar7 + lVar6 + 8);
        }
        rVar8 = vector<bool,_true>::get<true>
                          ((vector<bool,_true> *)
                           &context[1].config.profiler_settings._M_h._M_rehash_policy._M_next_resize
                           ,__n);
        WriteQuotedString((WriteStream *)cast_chunk,(WriteCSVData *)context,(char *)pdVar7,
                          (ulong)uVar1,(*rVar8._M_p & rVar8._M_mask) != 0);
      }
    }
  }
  return;
}

Assistant:

static void WriteCSVChunkInternal(ClientContext &context, FunctionData &bind_data, DataChunk &cast_chunk,
                                  MemoryStream &writer, DataChunk &input, bool &written_anything,
                                  ExpressionExecutor &executor) {
	auto &csv_data = bind_data.Cast<WriteCSVData>();
	auto &options = csv_data.options;

	// first cast the columns of the chunk to varchar
	cast_chunk.Reset();
	cast_chunk.SetCardinality(input);

	executor.Execute(input, cast_chunk);

	cast_chunk.Flatten();
	// now loop over the vectors and output the values
	for (idx_t row_idx = 0; row_idx < cast_chunk.size(); row_idx++) {
		if (row_idx == 0 && !written_anything) {
			written_anything = true;
		} else {
			writer.WriteData(const_data_ptr_cast(csv_data.newline.c_str()), csv_data.newline.size());
		}
		// write values
		D_ASSERT(options.null_str.size() == 1);
		for (idx_t col_idx = 0; col_idx < cast_chunk.ColumnCount(); col_idx++) {
			if (col_idx != 0) {
				WriteQuoteOrEscape(writer, options.dialect_options.state_machine_options.delimiter.GetValue()[0]);
			}
			if (FlatVector::IsNull(cast_chunk.data[col_idx], row_idx)) {
				// write null value
				writer.WriteData(const_data_ptr_cast(options.null_str[0].c_str()), options.null_str[0].size());
				continue;
			}

			// non-null value, fetch the string value from the cast chunk
			auto str_data = FlatVector::GetData<string_t>(cast_chunk.data[col_idx]);
			// FIXME: we could gain some performance here by checking for certain types if they ever require quotes
			// (e.g. integers only require quotes if the delimiter is a number, decimals only require quotes if the
			// delimiter is a number or "." character)
			WriteQuotedString(writer, csv_data, str_data[row_idx].GetData(), str_data[row_idx].GetSize(),
			                  csv_data.options.force_quote[col_idx]);
		}
	}
}